

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qframe.cpp
# Opt level: O3

void __thiscall QFramePrivate::updateStyledFrameWidths(QFramePrivate *this)

{
  QWidget *this_00;
  short sVar1;
  QStyle *pQVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  long in_FS_OFFSET;
  undefined1 auVar6 [16];
  QStyleOptionFrame opt;
  undefined1 local_78 [16];
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  QPalettePrivate *pQStack_50;
  undefined1 *local_48;
  QObject *pQStack_40;
  undefined1 *local_38;
  undefined1 *puStack_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  pQStack_40 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  pQStack_50 = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QStyleOptionFrame::QStyleOptionFrame((QStyleOptionFrame *)local_78);
  (**(code **)(*(long *)this_00 + 0x1a0))(this_00,local_78);
  pQVar2 = QWidget::style(this_00);
  auVar6 = (**(code **)(*(long *)pQVar2 + 0xc0))(pQVar2,0x33,local_78,this_00);
  sVar4 = auVar6._0_2_ - (short)local_68;
  this->leftFrameWidth = sVar4;
  sVar1 = auVar6._4_2_ - (short)((ulong)local_68 >> 0x20);
  this->topFrameWidth = sVar1;
  sVar3 = (short)puStack_60 - auVar6._8_2_;
  this->rightFrameWidth = sVar3;
  sVar5 = (short)((ulong)puStack_60 >> 0x20) - auVar6._12_2_;
  if (sVar3 < sVar4) {
    sVar3 = sVar4;
  }
  this->bottomFrameWidth = sVar5;
  if (sVar5 < sVar1) {
    sVar5 = sVar1;
  }
  if (sVar5 < sVar3) {
    sVar5 = sVar3;
  }
  this->frameWidth = sVar5;
  QStyleOption::~QStyleOption((QStyleOption *)local_78);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFramePrivate::updateStyledFrameWidths()
{
    Q_Q(const QFrame);
    QStyleOptionFrame opt;
    q->initStyleOption(&opt);

    QRect cr = q->style()->subElementRect(QStyle::SE_ShapedFrameContents, &opt, q);
    leftFrameWidth = cr.left() - opt.rect.left();
    topFrameWidth = cr.top() - opt.rect.top();
    rightFrameWidth = opt.rect.right() - cr.right(),
    bottomFrameWidth = opt.rect.bottom() - cr.bottom();
    frameWidth = qMax(qMax(leftFrameWidth, rightFrameWidth),
                      qMax(topFrameWidth, bottomFrameWidth));
}